

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddLinear.c
# Opt level: O1

Move * ddLinearAndSiftingDown(DdManager *table,int x,int xHigh,Move *prevMoves)

{
  int x_00;
  int iVar1;
  uint uVar2;
  int iVar3;
  DdHalfWord DVar4;
  DdHalfWord y;
  uint uVar5;
  uint uVar6;
  DdNode *pDVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  DdNode *pDVar11;
  DdHalfWord local_4c;
  
  x_00 = table->invperm[x];
  uVar2 = table->keys - table->isolated;
  iVar10 = 0;
  if (x < xHigh) {
    lVar9 = (long)xHigh;
    lVar8 = lVar9 * 0xe + 4;
    iVar10 = 0;
    do {
      iVar1 = table->invperm[lVar9];
      iVar3 = cuddTestInteract(table,x_00,iVar1);
      if (iVar3 != 0) {
        iVar10 = (iVar10 - (uint)(table->vars[iVar1]->ref == 1)) +
                 *(int *)((long)&table->subtables->nodelist + lVar8 * 4);
      }
      lVar9 = lVar9 + -1;
      lVar8 = lVar8 + -0xe;
    } while (x < lVar9);
  }
  DVar4 = cuddNextHigh(table,x);
  if ((xHigh < (int)DVar4) || (local_4c = x, iVar10 < 1)) {
    return prevMoves;
  }
  while( true ) {
    y = DVar4;
    iVar1 = table->invperm[(int)y];
    iVar3 = cuddTestInteract(table,x_00,iVar1);
    if (iVar3 != 0) {
      iVar10 = (iVar10 + (uint)(table->vars[iVar1]->ref == 1)) - table->subtables[(int)y].keys;
    }
    uVar5 = cuddSwapInPlace(table,local_4c,y);
    if (((uVar5 == 0) || (uVar6 = cuddLinearInPlace(table,local_4c,y), uVar6 == 0)) ||
       (pDVar7 = cuddDynamicAllocNode(table), pDVar7 == (DdNode *)0x0)) break;
    pDVar7->index = local_4c;
    pDVar7->ref = y;
    (pDVar7->type).kids.T = (DdNode *)prevMoves;
    *(undefined4 *)&pDVar7->next = 0;
    prevMoves = (Move *)pDVar7;
    if ((int)uVar6 < (int)uVar5) {
      iVar3 = cuddTestInteract(table,x_00,iVar1);
      if (iVar3 != 0) {
        *(undefined4 *)&pDVar7->next = 1;
        cuddUpdateInteractionMatrix(table,x_00,iVar1);
        uVar5 = uVar6;
      }
    }
    else {
      uVar6 = cuddLinearInPlace(table,local_4c,y);
      if (uVar6 == 0) break;
      if (uVar6 != uVar5) {
        fprintf((FILE *)table->out,"Change in size after identity transformation! From %d to %d\n",
                (ulong)uVar5,(ulong)uVar6);
      }
    }
    *(uint *)((long)&pDVar7->next + 4) = uVar5;
    if ((double)(int)uVar2 * table->maxGrowth < (double)(int)uVar5) {
      return (Move *)pDVar7;
    }
    if ((int)uVar5 < (int)uVar2) {
      uVar2 = uVar5;
    }
    DVar4 = cuddNextHigh(table,y);
    if (xHigh < (int)DVar4) {
      return (Move *)pDVar7;
    }
    local_4c = y;
    if ((int)uVar2 <= (int)(uVar5 - iVar10)) {
      return (Move *)pDVar7;
    }
  }
  if ((DdNode *)prevMoves != (DdNode *)0x0) {
    pDVar7 = table->nextFree;
    do {
      pDVar11 = (DdNode *)prevMoves;
      prevMoves = (Move *)(pDVar11->type).kids.T;
      pDVar11->ref = 0;
      pDVar11->next = pDVar7;
      pDVar7 = pDVar11;
    } while ((DdNode *)prevMoves != (DdNode *)0x0);
    table->nextFree = pDVar11;
  }
  return (Move *)0xffffffffffffffff;
}

Assistant:

static Move *
ddLinearAndSiftingDown(
  DdManager * table,
  int  x,
  int  xHigh,
  Move * prevMoves)
{
    Move        *moves;
    Move        *move;
    int         y;
    int         size, newsize;
    int         R;      /* upper bound on node decrease */
    int         limitSize;
    int         xindex, yindex;
    int         isolated;
#ifdef DD_DEBUG
    int         checkR;
    int         z;
    int         zindex;
#endif

    moves = prevMoves;
    /* Initialize R */
    xindex = table->invperm[x];
    limitSize = size = table->keys - table->isolated;
    R = 0;
    for (y = xHigh; y > x; y--) {
        yindex = table->invperm[y];
        if (cuddTestInteract(table,xindex,yindex)) {
            isolated = table->vars[yindex]->ref == 1;
            R += table->subtables[y].keys - isolated;
        }
    }

    y = cuddNextHigh(table,x);
    while (y <= xHigh && size - R < limitSize) {
#ifdef DD_DEBUG
        checkR = 0;
        for (z = xHigh; z > x; z--) {
            zindex = table->invperm[z];
            if (cuddTestInteract(table,xindex,zindex)) {
                isolated = table->vars[zindex]->ref == 1;
                checkR += table->subtables[z].keys - isolated;
            }
        }
        if (R != checkR) {
            (void) fprintf(table->out, "checkR(%d) != R(%d)\n",checkR,R);
        }
#endif
        /* Update upper bound on node decrease. */
        yindex = table->invperm[y];
        if (cuddTestInteract(table,xindex,yindex)) {
            isolated = table->vars[yindex]->ref == 1;
            R -= table->subtables[y].keys - isolated;
        }
        size = cuddSwapInPlace(table,x,y);
        if (size == 0) goto ddLinearAndSiftingDownOutOfMem;
        newsize = cuddLinearInPlace(table,x,y);
        if (newsize == 0) goto ddLinearAndSiftingDownOutOfMem;
        move = (Move *) cuddDynamicAllocNode(table);
        if (move == NULL) goto ddLinearAndSiftingDownOutOfMem;
        move->x = x;
        move->y = y;
        move->next = moves;
        moves = move;
        move->flags = CUDD_SWAP_MOVE;
        if (newsize >= size) {
            /* Undo transformation. The transformation we apply is
            ** its own inverse. Hence, we just apply the transformation
            ** again.
            */
            newsize = cuddLinearInPlace(table,x,y);
            if (newsize == 0) goto ddLinearAndSiftingDownOutOfMem;
            if (newsize != size) {
                (void) fprintf(table->out,"Change in size after identity transformation! From %d to %d\n",size,newsize);
            }
        } else if (cuddTestInteract(table,xindex,yindex)) {
            size = newsize;
            move->flags = CUDD_LINEAR_TRANSFORM_MOVE;
            cuddUpdateInteractionMatrix(table,xindex,yindex);
        }
        move->size = size;
        if ((double) size > (double) limitSize * table->maxGrowth) break;
        if (size < limitSize) limitSize = size;
        x = y;
        y = cuddNextHigh(table,x);
    }
    return(moves);

ddLinearAndSiftingDownOutOfMem:
    while (moves != NULL) {
        move = moves->next;
        cuddDeallocMove(table, moves);
        moves = move;
    }
    return((Move *) CUDD_OUT_OF_MEM);

}